

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::MILSpec::Dimension::ByteSizeLong(Dimension *this)

{
  ulong uVar1;
  size_t sVar2;
  
  if (this->_oneof_case_[0] == 2) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::Dimension_UnknownDimension>
                      ((this->dimension_).unknown_);
  }
  else {
    if (this->_oneof_case_[0] != 1) {
      sVar2 = 0;
      goto LAB_001ad474;
    }
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::Dimension_ConstantDimension>
                      ((this->dimension_).constant_);
  }
  sVar2 = sVar2 + 1;
LAB_001ad474:
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t Dimension::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Dimension)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (dimension_case()) {
    // .CoreML.Specification.MILSpec.Dimension.ConstantDimension constant = 1;
    case kConstant: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *dimension_.constant_);
      break;
    }
    // .CoreML.Specification.MILSpec.Dimension.UnknownDimension unknown = 2;
    case kUnknown: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *dimension_.unknown_);
      break;
    }
    case DIMENSION_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}